

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O3

floatx80 propagateFloatx80NaN_arm(floatx80 a,floatx80 b,float_status *status)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  floatx80 fVar8;
  
  uVar3 = a._8_4_;
  uVar2 = b._8_4_;
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
      (~uVar3 & 0x7fff) != 0) {
    bVar4 = 2;
    if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
        (~uVar2 & 0x7fff) == 0) goto LAB_0054daab;
LAB_0054dade:
    bVar5 = false;
    bVar7 = false;
  }
  else {
    bVar5 = ((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0;
    bVar6 = ((undefined1  [16])a & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0;
    if ((~uVar2 & 0x7fff) == 0 &&
        ((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
      bVar4 = (bVar6 && bVar5) | 4;
LAB_0054daab:
      bVar6 = ((undefined1  [16])b & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0;
      bVar7 = ((undefined1  [16])b & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0;
      bVar5 = bVar4 == 5;
      if (!bVar5 && (!bVar7 || !bVar6)) goto LAB_0054dade;
      bVar7 = !bVar5 || bVar7 && bVar6;
    }
    else {
      bVar4 = 4;
      bVar7 = false;
      if (!bVar6 || !bVar5) goto LAB_0054dade;
      bVar5 = true;
      bVar4 = 5;
    }
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  if (status->default_nan_mode == '\0') {
    if (bVar5) {
      uVar1 = a.low | 0xc000000000000000;
      uVar2 = uVar3;
    }
    else if (bVar7) {
      uVar1 = b.low | 0xc000000000000000;
    }
    else {
      uVar1 = b.low;
      if (bVar4 == 4) {
        uVar1 = a.low;
        uVar2 = uVar3;
      }
    }
  }
  else {
    uVar1 = 0xc000000000000000;
    uVar2 = (uint)CONCAT62(b._10_6_,0xffff);
  }
  fVar8._8_4_ = uVar2;
  fVar8.low = uVar1;
  fVar8._12_4_ = 0;
  return fVar8;
}

Assistant:

floatx80 propagateFloatx80NaN(floatx80 a, floatx80 b, float_status *status)
{
    flag aIsLargerSignificand;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!floatx80_is_any_nan(a)
             ? float_class_normal
             : floatx80_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!floatx80_is_any_nan(b)
             ? float_class_normal
             : floatx80_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return floatx80_default_nan(status);
    }

    if (a.low < b.low) {
        aIsLargerSignificand = 0;
    } else if (b.low < a.low) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (a.high < b.high) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return floatx80_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return floatx80_silence_nan(a, status);
        }
        return a;
    }
}